

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O0

void __thiscall
iqxmlrpc::http::Response_header::Response_header(Response_header *this,int c,string *p)

{
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  string local_78;
  allocator<char> local_51;
  string local_50;
  string *local_20;
  string *p_local;
  Response_header *pRStack_10;
  int c_local;
  Response_header *this_local;
  
  local_20 = p;
  p_local._4_4_ = c;
  pRStack_10 = this;
  Header::Header(&this->super_Header,HTTP_CHECK_WEAK);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_002528d0;
  *(int *)&(this->super_Header).field_0x8c = p_local._4_4_;
  std::__cxx11::string::string((string *)&this->phrase_,(string *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"date",&local_51);
  current_date_abi_cxx11_(&local_78,this);
  Header::set_option(&this->super_Header,&local_50,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"server",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"Libiqxmlrpc 0.13.6",&local_c1);
  Header::set_option(&this->super_Header,&local_98,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  return;
}

Assistant:

Response_header::Response_header( int c, const std::string& p ):
  code_(c),
  phrase_(p)
{
  set_option(names::date, current_date());
  set_option(names::server, PACKAGE " " VERSION);
}